

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O1

void updateHashChain(Hash *hash,size_t wpos,uint hashval,unsigned_short numzeros)

{
  hash->val[wpos] = hashval;
  if (hash->head[hashval] != -1) {
    hash->chain[wpos] = (unsigned_short)hash->head[hashval];
  }
  hash->head[hashval] = (int)wpos;
  hash->zeros[wpos] = numzeros;
  if (hash->headz[numzeros] != -1) {
    hash->chainz[wpos] = (unsigned_short)hash->headz[numzeros];
  }
  hash->headz[numzeros] = (int)wpos;
  return;
}

Assistant:

static void updateHashChain(Hash* hash, size_t wpos, unsigned hashval, unsigned short numzeros)
{
	hash->val[wpos] = (int)hashval;
	if (hash->head[hashval] != -1) hash->chain[wpos] = hash->head[hashval];
	hash->head[hashval] = wpos;

	hash->zeros[wpos] = numzeros;
	if (hash->headz[numzeros] != -1) hash->chainz[wpos] = hash->headz[numzeros];
	hash->headz[numzeros] = wpos;
}